

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O3

S2CellId __thiscall S2PaddedCell::ShrinkToFit(S2PaddedCell *this,R2Rect *rect)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  S2CellId SVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  S2LogMessage *pSVar11;
  double dVar12;
  R2Rect padded;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  S2PaddedCell *local_70;
  ulong local_68;
  S2LogMessage local_60;
  S2LogMessage local_50;
  R2Point local_40;
  
  bVar2 = R2Rect::Intersects(&this->bound_,rect);
  if (!bVar2) {
    S2LogMessage::S2LogMessage
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2padded_cell.cc"
               ,0x7b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_60.stream_,"Check failed: bound().Intersects(rect) ",0x27);
LAB_00203fb7:
    abort();
  }
  iVar7 = 1 << (0x1eU - (char)this->level_ & 0x1f);
  if (this->level_ == 0) {
    if (((0.0 < rect->bounds_[0].bounds_.c_[0]) || (rect->bounds_[0].bounds_.c_[1] < 0.0)) &&
       ((0.0 < rect->bounds_[1].bounds_.c_[0] || (rect->bounds_[1].bounds_.c_[1] < 0.0)))) {
LAB_00203c6f:
      local_40.c_[0] = this->padding_ + 3.3306690738754696e-16;
      pSVar11 = &local_60;
      local_70 = this;
      local_40.c_[1] = local_40.c_[0];
      R2Rect::Expanded(rect,&local_40);
      local_68 = (ulong)(iVar7 - 1);
      puVar5 = &local_74;
      puVar9 = &local_7c;
      lVar10 = 0;
      bVar2 = true;
      do {
        bVar6 = bVar2;
        dVar12 = *(double *)pSVar11 * 3.0;
        if (0.0 <= *(double *)pSVar11) {
          dVar12 = dVar12 + 1.0;
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          dVar12 = dVar12 * 0.5;
        }
        else {
          dVar12 = 1.0 - dVar12;
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          dVar12 = dVar12 * -0.5 + 1.0;
        }
        uVar8 = (uint)ROUND(dVar12 * 1073741824.0 + -0.5);
        if (0x3ffffffe < (int)uVar8) {
          uVar8 = 0x3fffffff;
        }
        uVar1 = local_70->ij_lo_[lVar10];
        if ((int)uVar8 <= (int)uVar1) {
          uVar8 = uVar1;
        }
        if ((int)uVar8 < 1) {
          uVar8 = 0;
        }
        *puVar5 = uVar8;
        dVar12 = (double)pSVar11->stream_ * 3.0;
        if (0.0 <= (double)pSVar11->stream_) {
          dVar12 = dVar12 + 1.0;
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          dVar12 = dVar12 * 0.5;
        }
        else {
          dVar12 = 1.0 - dVar12;
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          dVar12 = dVar12 * -0.5 + 1.0;
        }
        uVar3 = (uint)ROUND(dVar12 * 1073741824.0 + -0.5);
        if (0x3ffffffe < (int)uVar3) {
          uVar3 = 0x3fffffff;
        }
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        if ((int)(uVar1 + (int)local_68) <= (int)uVar3) {
          uVar3 = uVar1 + (int)local_68;
        }
        *puVar9 = uVar3 ^ uVar8;
        lVar10 = 1;
        puVar9 = &local_80;
        puVar5 = &local_78;
        pSVar11 = &local_50;
        bVar2 = false;
      } while (bVar6);
      uVar8 = (local_80 | local_7c) * 2 + 1;
      uVar1 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar7 = (uVar1 ^ 0x1f) - 1;
      if (local_70->level_ < iVar7) {
        local_40.c_[0] =
             (VType)S2CellId::FromFaceIJ((uint)((local_70->id_).id_ >> 0x3d),local_74,local_78);
        SVar4 = S2CellId::parent((S2CellId *)&local_40,iVar7);
        return (S2CellId)SVar4.id_;
      }
      return (S2CellId)(local_70->id_).id_;
    }
  }
  else {
    uVar8 = iVar7 + this->ij_lo_[0] * 2;
    if (0x80000000 < uVar8) {
      S2LogMessage::S2LogMessage
                (&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
                 ,0x153,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_60.stream_,"Check failed: (si) <= (kMaxSiTi) ",0x21);
      goto LAB_00203fb7;
    }
    dVar12 = (double)uVar8 * 4.656612873077393e-10;
    if (0.5 <= dVar12) {
      dVar12 = dVar12 * 4.0 * dVar12 + -1.0;
    }
    else {
      dVar12 = (1.0 - dVar12) * -4.0 * (1.0 - dVar12) + 1.0;
    }
    if ((dVar12 * 0.3333333333333333 < rect->bounds_[0].bounds_.c_[0]) ||
       (rect->bounds_[0].bounds_.c_[1] < dVar12 * 0.3333333333333333)) {
      uVar8 = iVar7 + this->ij_lo_[1] * 2;
      if (0x80000000 < uVar8) {
        S2LogMessage::S2LogMessage
                  (&local_60,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2coords.h"
                   ,0x153,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_60.stream_,"Check failed: (si) <= (kMaxSiTi) ",0x21);
        goto LAB_00203fb7;
      }
      dVar12 = (double)uVar8 * 4.656612873077393e-10;
      if (0.5 <= dVar12) {
        dVar12 = dVar12 * 4.0 * dVar12 + -1.0;
      }
      else {
        dVar12 = (1.0 - dVar12) * -4.0 * (1.0 - dVar12) + 1.0;
      }
      if ((dVar12 * 0.3333333333333333 < rect->bounds_[1].bounds_.c_[0]) ||
         (rect->bounds_[1].bounds_.c_[1] < dVar12 * 0.3333333333333333)) goto LAB_00203c6f;
    }
  }
  return (S2CellId)(this->id_).id_;
}

Assistant:

S2CellId S2PaddedCell::ShrinkToFit(const R2Rect& rect) const {
  S2_DCHECK(bound().Intersects(rect));

  // Quick rejection test: if "rect" contains the center of this cell along
  // either axis, then no further shrinking is possible.
  int ij_size = S2CellId::GetSizeIJ(level_);
  if (level_ == 0) {
    // Fast path (most calls to this function start with a face cell).
    if (rect[0].Contains(0) || rect[1].Contains(0)) return id();
  } else {
    if (rect[0].Contains(S2::STtoUV(S2::SiTitoST(2 * ij_lo_[0] + ij_size))) ||
        rect[1].Contains(S2::STtoUV(S2::SiTitoST(2 * ij_lo_[1] + ij_size)))) {
      return id();
    }
  }
  // Otherwise we expand "rect" by the given padding() on all sides and find
  // the range of coordinates that it spans along the i- and j-axes.  We then
  // compute the highest bit position at which the min and max coordinates
  // differ.  This corresponds to the first cell level at which at least two
  // children intersect "rect".

  // Increase the padding to compensate for the error in S2::UVtoST().
  // (The constant below is a provable upper bound on the additional error.)
  R2Rect padded = rect.Expanded(padding() + 1.5 * DBL_EPSILON);
  int ij_min[2];  // Min i- or j- coordinate spanned by "padded"
  int ij_xor[2];  // XOR of the min and max i- or j-coordinates
  for (int d = 0; d < 2; ++d) {
    ij_min[d] = max(ij_lo_[d], S2::STtoIJ(S2::UVtoST(padded[d][0])));
    int ij_max = min(ij_lo_[d] + ij_size - 1,
                     S2::STtoIJ(S2::UVtoST(padded[d][1])));
    ij_xor[d] = ij_min[d] ^ ij_max;
  }
  // Compute the highest bit position where the two i- or j-endpoints differ,
  // and then choose the cell level that includes both of these endpoints.  So
  // if both pairs of endpoints are equal we choose kMaxLevel; if they differ
  // only at bit 0, we choose (kMaxLevel - 1), and so on.
  int level_msb = ((ij_xor[0] | ij_xor[1]) << 1) + 1;
  int level = S2CellId::kMaxLevel - Bits::FindMSBSetNonZero(level_msb);
  if (level <= level_) return id();
  return S2CellId::FromFaceIJ(id().face(), ij_min[0], ij_min[1]).parent(level);
}